

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

void tinyformat::format<long,long,long,long>
               (ostream *out,char *fmt,long *args,long *args_1,long *args_2,long *args_3)

{
  FormatList local_70;
  FormatArg local_60;
  long *local_48;
  code *local_40;
  code *local_38;
  long *local_30;
  code *local_28;
  code *local_20;
  long *local_18;
  code *local_10;
  code *local_8;
  
  local_70.m_formatters = &local_60;
  local_70.m_N = 4;
  local_60.m_formatImpl = detail::FormatArg::formatImpl<long>;
  local_60.m_toIntImpl = detail::FormatArg::toIntImpl<long>;
  local_40 = detail::FormatArg::formatImpl<long>;
  local_38 = detail::FormatArg::toIntImpl<long>;
  local_28 = detail::FormatArg::formatImpl<long>;
  local_20 = detail::FormatArg::toIntImpl<long>;
  local_10 = detail::FormatArg::formatImpl<long>;
  local_8 = detail::FormatArg::toIntImpl<long>;
  local_60.m_value = args;
  local_48 = args_1;
  local_30 = args_2;
  local_18 = args_3;
  vformat(out,fmt,&local_70);
  return;
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}